

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valinvokegen.cpp
# Opt level: O0

Am_Object am_commandinvokegen_Initialize(void)

{
  Am_Slot_Key AVar1;
  Am_Method_Wrapper *pAVar2;
  Am_Object *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object *pAVar5;
  Am_Value_List *pAVar6;
  Am_Constraint *pAVar7;
  Am_Object_Data *in_RDI;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Value_List local_b8;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Value_List local_60;
  Am_Object local_50;
  Am_Object local_48;
  Am_Font local_40;
  Am_Object local_38;
  Am_Object local_30 [3];
  Am_Object local_18 [2];
  
  Am_Object::Create(local_18,(char *)&Am_Window);
  pAVar2 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_
                     (&Am_Default_Pop_Up_Window_Destroy_Method);
  pAVar3 = Am_Object::Set(local_18,0x89,pAVar2,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar4,0);
  pAVar3 = Am_Object::Set(pAVar3,0x6c,"Generalize Command for Match",0);
  pAVar3 = Am_Object::Set(pAVar3,0x66,0x1d8,0);
  pAVar3 = Am_Object::Set(pAVar3,0x67,0x96,0);
  pAVar3 = Am_Object::Add(pAVar3,0xc5,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0xb8,0,0);
  pAVar3 = Am_Object::Add(pAVar3,Am_SCRIPT_WINDOW,0,0);
  pAVar3 = Am_Object::Add(pAVar3,Am_PLACEHOLDERS_SET_BY_THIS_COMMAND,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0x169,0,0);
  pAVar3 = Am_Object::Add(pAVar3,Am_INVOKE_MATCH_COMMAND,0,0);
  Am_Object::operator=(&am_commandinvokegen,pAVar3);
  Am_Object::~Am_Object(local_18);
  Am_Object::Create(&local_38,(char *)&Am_Text);
  pAVar3 = Am_Object::Set(&local_38,100,9,0);
  pAVar3 = Am_Object::Set(pAVar3,0x65,9,0);
  pAVar3 = Am_Object::Set(pAVar3,0xab,"Generalize the command for match",0);
  Am_Font::Am_Font(&local_40,Am_FONT_FIXED,true,false,false,Am_FONT_LARGE);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_(&local_40);
  pAVar3 = Am_Object::Set(pAVar3,0xac,pAVar4,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar3 = Am_Object::Set(pAVar3,0x6b,pAVar4,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_No_Style);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar4,0);
  Am_Object::Am_Object(local_30,pAVar3);
  Am_Object::Add_Part(&am_commandinvokegen,local_30,true,0);
  Am_Object::~Am_Object(local_30);
  Am_Font::~Am_Font(&local_40);
  Am_Object::~Am_Object(&local_38);
  AVar1 = Am_UNDO_OPTIONS;
  Am_Object::Create(&local_50,(char *)&Am_Radio_Button_Panel);
  pAVar3 = Am_Object::Set(&local_50,100,0xf,0);
  pAVar3 = Am_Object::Set(pAVar3,0x65,0x28,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar4,0);
  Am_Value_List::Am_Value_List(&local_60);
  Am_Object::Create(&local_68,(char *)&Am_Command);
  pAVar5 = Am_Object::Set(&local_68,0x150,"The specific command: ",0);
  pAVar5 = Am_Object::Set(pAVar5,0x153,1,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar5);
  pAVar6 = Am_Value_List::Add(&local_60,pAVar4,Am_TAIL,true);
  Am_Object::Create(&local_70,(char *)&Am_Command);
  pAVar5 = Am_Object::Set(&local_70,0x150,"Any command",0);
  pAVar5 = Am_Object::Set(pAVar5,0x153,0x20,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar5);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar4,Am_TAIL,true);
  Am_Object::Create(&local_78,(char *)&Am_Command);
  pAVar5 = Am_Object::Set(&local_78,0x150,"Custom...",0);
  pAVar5 = Am_Object::Set(pAVar5,0xcc,false,0);
  pAVar5 = Am_Object::Set(pAVar5,0x153,6,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar5);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar4,Am_TAIL,true);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar3 = Am_Object::Set(pAVar3,0xa2,pAVar4,0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Vertical_Layout);
  pAVar3 = Am_Object::Set(pAVar3,0x94,pAVar7,0);
  pAVar3 = Am_Object::Set(pAVar3,0x95,0,0);
  Am_Object::Am_Object(&local_48,pAVar3);
  Am_Object::Add_Part(&am_commandinvokegen,AVar1,&local_48,0);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_68);
  Am_Value_List::~Am_Value_List(&local_60);
  Am_Object::~Am_Object(&local_50);
  AVar1 = Am_CONSTANT_OBJECTS_WIDGET;
  Am_Object::Create(&local_98,(char *)&Am_Text_Input_Widget);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&am_active_if_constant_sel);
  pAVar3 = Am_Object::Set(&local_98,0xcc,pAVar7,0);
  pAVar3 = Am_Object::Set(pAVar3,100,0xb9,0);
  pAVar3 = Am_Object::Set(pAVar3,0x65,0x2a,0);
  pAVar3 = Am_Object::Set(pAVar3,0x66,0xc1,0);
  pAVar3 = Am_Object::Add(pAVar3,0xfa,&Am_No_Value,0);
  pAVar3 = Am_Object::Set(pAVar3,0x17d,false,0);
  Am_Object::Get_Object(&local_90,(Am_Slot_Key)pAVar3,0xc5);
  pAVar3 = Am_Object::Set(&local_90,0x150,"",0);
  Am_Object::Get_Owner(&local_88,(Am_Slot_Flags)pAVar3);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar3 = Am_Object::Set(&local_88,0x6a,pAVar4,0);
  Am_Object::Am_Object(&local_80,pAVar3);
  Am_Object::Add_Part(&am_commandinvokegen,AVar1,&local_80,0);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_98);
  Am_Object::Create(&local_a8,(char *)&Am_Button_Panel);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Center_X_Is_Center_Of_Owner);
  pAVar3 = Am_Object::Set(&local_a8,100,pAVar7,0);
  pAVar3 = Am_Object::Set(pAVar3,0x65,0x73,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar4,0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Horizontal_Layout);
  pAVar3 = Am_Object::Set(pAVar3,0x94,pAVar7,0);
  pAVar3 = Am_Object::Set(pAVar3,0x95,0x14,0);
  pAVar3 = Am_Object::Set(pAVar3,0x96,0,0);
  pAVar3 = Am_Object::Set(pAVar3,0x9c,0,0);
  Am_Value_List::Am_Value_List(&local_b8);
  Am_Object::Create(&local_c0,(char *)&Am_Standard_OK_Command);
  pAVar2 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_commandinvokegen_ok);
  pAVar5 = Am_Object::Set(&local_c0,0xca,pAVar2,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar5);
  pAVar6 = Am_Value_List::Add(&local_b8,pAVar4,Am_TAIL,true);
  Am_Object::Create(&local_c8,(char *)&Am_Standard_Cancel_Command);
  pAVar2 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_commandinvokegen_cancel);
  pAVar5 = Am_Object::Set(&local_c8,0xca,pAVar2,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar5);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar4,Am_TAIL,true);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar3 = Am_Object::Set(pAVar3,0xa2,pAVar4,0);
  Am_Object::Am_Object(&local_a0,pAVar3);
  Am_Object::Add_Part(&am_commandinvokegen,&local_a0,true,0);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_c8);
  Am_Object::~Am_Object(&local_c0);
  Am_Value_List::~Am_Value_List(&local_b8);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::Create(&local_d0,(char *)&Am_Tab_To_Next_Widget_Interactor);
  Am_Object::Add_Part(&am_commandinvokegen,&local_d0,true,0);
  Am_Object::~Am_Object(&local_d0);
  Am_Object::Am_Object((Am_Object *)in_RDI,&am_commandinvokegen);
  return (Am_Object)in_RDI;
}

Assistant:

Am_Object
am_commandinvokegen_Initialize()
{
  am_commandinvokegen = Am_Window.Create(DSTR("am_commandinvokegen"))
                            .Set(Am_DESTROY_WINDOW_METHOD,
                                 Am_Default_Pop_Up_Window_Destroy_Method)
                            .Set(Am_FILL_STYLE, Am_Default_Color)
                            .Set(Am_TITLE, "Generalize Command for Match")
                            .Set(Am_WIDTH, 472)
                            .Set(Am_HEIGHT, 150)

                            .Add(Am_COMMAND, (0L))
                            .Add(Am_SLOTS_TO_SAVE, (0L))
                            .Add(Am_SCRIPT_WINDOW, (0L))
                            .Add(Am_PLACEHOLDERS_SET_BY_THIS_COMMAND, (0L))
                            .Add(Am_VALUE, (0L)) //the real value
                            .Add(Am_INVOKE_MATCH_COMMAND, (0L));
  am_commandinvokegen.Add_Part(
      Am_Text.Create()
          .Set(Am_LEFT, 9)
          .Set(Am_TOP, 9)
          .Set(Am_TEXT, "Generalize the command for match")
          .Set(Am_FONT,
               Am_Font(Am_FONT_FIXED, true, false, false, Am_FONT_LARGE))
          .Set(Am_LINE_STYLE, Am_Black)
          .Set(Am_FILL_STYLE, Am_No_Style));
  am_commandinvokegen.Add_Part(
      Am_UNDO_OPTIONS,
      Am_Radio_Button_Panel.Create(DSTR("radio control"))
          .Set(Am_LEFT, 15)
          .Set(Am_TOP, 40)
          .Set(Am_FILL_STYLE, Am_Default_Color)
          .Set(Am_ITEMS, Am_Value_List()
                             .Add(Am_Command.Create()
                                      .Set(Am_LABEL, "The specific command: ")
                                      .Set(Am_ID, am_constant_generalize))
                             .Add(Am_Command.Create()
                                      .Set(Am_LABEL, "Any command")
                                      .Set(Am_ID, am_any_value_generalize))
                             .Add(Am_Command.Create()
                                      .Set(Am_LABEL, "Custom...")
                                      .Set(Am_ACTIVE, false)
                                      .Set(Am_ID, am_custom_generalize)))
          .Set(Am_LAYOUT, Am_Vertical_Layout)
          .Set(Am_H_SPACING, 0));
  am_commandinvokegen.Add_Part(
      Am_CONSTANT_OBJECTS_WIDGET,
      Am_Text_Input_Widget.Create(DSTR("CONSTANT_OBJECTS_WIDGET"))
          .Set(Am_ACTIVE, am_active_if_constant_sel)
          .Set(Am_LEFT, 185)
          .Set(Am_TOP, 42)
          .Set(Am_WIDTH, 193)
          .Add(Am_VALUES, Am_No_Value) //set with old value
          .Set(Am_ACTIVE_2, false)
          .Get_Object(Am_COMMAND)
          .Set(Am_LABEL, "")
          .Get_Owner()
          .Set(Am_FILL_STYLE, Am_Default_Color));
  am_commandinvokegen.Add_Part(
      Am_Button_Panel.Create(DSTR("OK-cancel"))
          .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
          .Set(Am_TOP, 115)
          .Set(Am_FILL_STYLE, Am_Default_Color)
          .Set(Am_LAYOUT, Am_Horizontal_Layout)
          .Set(Am_H_SPACING, 20)
          .Set(Am_V_SPACING, 0)
          .Set(Am_MAX_RANK, 0)
          .Set(Am_ITEMS, Am_Value_List()
                             .Add(Am_Standard_OK_Command.Create().Set(
                                 Am_DO_METHOD, am_commandinvokegen_ok))
                             .Add(Am_Standard_Cancel_Command.Create().Set(
                                 Am_DO_METHOD, am_commandinvokegen_cancel))));
  am_commandinvokegen.Add_Part(Am_Tab_To_Next_Widget_Interactor.Create());
  return am_commandinvokegen;
}